

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ParseResult *
read_list(ParseResult *__return_storage_ptr__,istream *is,shared_ptr<ASTNode> *node,bool square)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  element_type *peVar3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  _Node *p_Var7;
  string local_60;
  shared_ptr<ASTNode> *local_40;
  shared_ptr<ASTNode> *local_38;
  
  ((node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type = LIST;
  local_40 = node;
  skip_whitespace(is);
  iVar6 = std::istream::peek();
  local_38 = &__return_storage_ptr__->node;
  paVar1 = &(__return_storage_ptr__->error).field_2;
  do {
    if (iVar6 == -1) {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Unclosed list literal","");
      ParseResult::ParseResult(__return_storage_ptr__,&local_60);
LAB_0011fb12:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      return __return_storage_ptr__;
    }
    if ((iVar6 == 0x29) || (iVar6 == 0x5d)) {
      std::istream::get();
      if ((iVar6 != 0x5d) != square) {
        peVar3 = (local_40->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var5 = (local_40->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                 _M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
        }
        __return_storage_ptr__->result = OK;
        (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar3;
        (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var5;
        (__return_storage_ptr__->error)._M_dataplus._M_p = (pointer)paVar1;
        (__return_storage_ptr__->error)._M_string_length = 0;
        (__return_storage_ptr__->error).field_2._M_local_buf[0] = '\0';
        return __return_storage_ptr__;
      }
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Wrong closing bracket","");
      ParseResult::ParseResult(__return_storage_ptr__,&local_60);
      goto LAB_0011fb12;
    }
    read_object(__return_storage_ptr__,is);
    if (__return_storage_ptr__->result != OK) {
      return __return_storage_ptr__;
    }
    peVar3 = (local_40->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var7 = std::__cxx11::list<std::shared_ptr<ASTNode>,std::allocator<std::shared_ptr<ASTNode>>>::
             _M_create_node<std::shared_ptr<ASTNode>const&>
                       ((list<std::shared_ptr<ASTNode>,std::allocator<std::shared_ptr<ASTNode>>> *)
                        &peVar3->list,local_38);
    std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
    psVar2 = &(peVar3->list).
              super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
              ._M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
    iVar6 = skip_whitespace(is);
    pcVar4 = (__return_storage_ptr__->error)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != paVar1) {
      operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
    }
    p_Var5 = (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
  } while( true );
}

Assistant:

static ParseResult read_list(std::istream &is, const std::shared_ptr<ASTNode> &node, bool square)
{
    node->type = ast_type_t::LIST;
    skip_whitespace(is);
    int c = is.peek();
    while(c != EOF && c != ')' && c != ']')
    {
        auto object = read_object(is);
        if(object.result != parse_result_t::OK)
            return object;
        node->list.push_back(object.node);
        c = skip_whitespace(is);
    }
    if(c == EOF)
        return ParseResult("Unclosed list literal");
    is.get();
    if((c == ']') != square)
        return ParseResult("Wrong closing bracket");
    return ParseResult(node);
}